

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters *params)

{
  string local_318;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_2f8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_2d8;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_278;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_258;
  Resources res3;
  Resources res2;
  Resources res1;
  Resources res0;
  
  Environment::Environment(&env,(Context *)this,1);
  DescriptorSet::Resources::Resources(&res0,&env,(Parameters *)context);
  DescriptorSet::Resources::Resources(&res1,&env,(Parameters *)context);
  DescriptorSet::Resources::Resources(&res2,&env,(Parameters *)context);
  DescriptorSet::Resources::Resources(&res3,&env,(Parameters *)context);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_2f8,&env,&res0,params);
  local_318.field_2._M_allocated_capacity = (size_type)local_2f8.m_data.deleter.m_device;
  local_318.field_2._8_8_ = local_2f8.m_data.deleter.m_pool.m_internal;
  local_318._M_dataplus._M_p = (pointer)local_2f8.m_data.object.m_internal;
  local_318._M_string_length = (size_type)local_2f8.m_data.deleter.m_deviceIface;
  local_2f8.m_data.object.m_internal = 0;
  local_2f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2f8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2f8);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_2d8,&env,&res1,params);
  local_2f8.m_data.deleter.m_device = local_2d8.m_data.deleter.m_device;
  local_2f8.m_data.deleter.m_pool.m_internal = local_2d8.m_data.deleter.m_pool.m_internal;
  local_2f8.m_data.object.m_internal = local_2d8.m_data.object.m_internal;
  local_2f8.m_data.deleter.m_deviceIface = local_2d8.m_data.deleter.m_deviceIface;
  local_2d8.m_data.object.m_internal = 0;
  local_2d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2d8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2d8);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_278,&env,&res2,params);
  local_2d8.m_data.deleter.m_device = local_278.m_data.deleter.m_device;
  local_2d8.m_data.deleter.m_pool.m_internal = local_278.m_data.deleter.m_pool.m_internal;
  local_2d8.m_data.object.m_internal = local_278.m_data.object.m_internal;
  local_2d8.m_data.deleter.m_deviceIface = local_278.m_data.deleter.m_deviceIface;
  local_278.m_data.object.m_internal = 0;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_278);
  DescriptorSet::create((Move<vk::Handle<(vk::HandleType)22>_> *)&local_258,&env,&res3,params);
  local_278.m_data.deleter.m_device = local_258.m_data.deleter.m_device;
  local_278.m_data.deleter.m_pool.m_internal = local_258.m_data.deleter.m_pool.m_internal;
  local_278.m_data.object.m_internal = local_258.m_data.object.m_internal;
  local_278.m_data.deleter.m_deviceIface = local_258.m_data.deleter.m_deviceIface;
  local_258.m_data.object.m_internal = 0;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_258.m_data.deleter.m_device = (VkDevice)0x0;
  local_258.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_258);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_278);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Ok",(allocator<char> *)&local_2f8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  DescriptorSet::Resources::~Resources(&res3);
  DescriptorSet::Resources::~Resources(&res2);
  DescriptorSet::Resources::~Resources(&res1);
  DescriptorSet::Resources::~Resources(&res0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}